

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_goiftrue(FuncState *fs,expdesc *e)

{
  int iVar1;
  FuncState *in_RSI;
  FuncState *in_RDI;
  int pc;
  FuncState *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  luaK_dischargevars(in_RSI,(expdesc *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                    );
  iVar1 = *(int *)&in_RSI->f;
  if ((iVar1 == 2) || (iVar1 - 4U < 2)) {
    iVar1 = -1;
  }
  else if (iVar1 == 10) {
    invertjump(in_RSI,(expdesc *)CONCAT44(in_stack_ffffffffffffffec,10));
    iVar1 = *(int *)&in_RSI->h;
  }
  else {
    iVar1 = jumponcond(in_RDI,(expdesc *)in_RSI,in_stack_ffffffffffffffec);
  }
  luaK_concat(unaff_retaddr,(int *)in_RDI,(int)((ulong)in_RSI >> 0x20));
  luaK_patchtohere(in_RSI,iVar1);
  *(undefined4 *)&in_RSI->prev = 0xffffffff;
  return;
}

Assistant:

static void luaK_goiftrue(FuncState*fs,expdesc*e){
int pc;
luaK_dischargevars(fs,e);
switch(e->k){
case VK:case VKNUM:case VTRUE:{
pc=(-1);
break;
}
case VJMP:{
invertjump(fs,e);
pc=e->u.s.info;
break;
}
default:{
pc=jumponcond(fs,e,0);
break;
}
}
luaK_concat(fs,&e->f,pc);
luaK_patchtohere(fs,e->t);
e->t=(-1);
}